

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O0

int ip4_multicast_member(nni_plat_udp *udp,sockaddr *sa,_Bool join)

{
  int iVar1;
  int *piVar2;
  socklen_t local_bc;
  undefined1 local_b8 [4];
  socklen_t sz;
  sockaddr_storage local;
  sockaddr_in *sin;
  socklen_t local_28;
  ip_mreq mreq;
  _Bool join_local;
  sockaddr *sa_local;
  nni_plat_udp *udp_local;
  
  local_bc = 0x80;
  mreq.imr_multiaddr.s_addr._3_1_ = join;
  unique0x100000bd = sa;
  iVar1 = getsockname(udp->udp_fd,(sockaddr *)local_b8,&local_bc);
  if (iVar1 < 0) {
    local_28 = 0;
  }
  else {
    if (local_b8._0_2_ != 2) {
      return 0xf;
    }
    local_28 = sz;
  }
  local.__ss_align = (unsigned_long)stack0xffffffffffffffe0;
  sin._4_4_ = *(undefined4 *)(stack0xffffffffffffffe0->sa_data + 2);
  iVar1 = 0x24;
  if ((mreq.imr_multiaddr.s_addr._3_1_ & 1) != 0) {
    iVar1 = 0x23;
  }
  iVar1 = setsockopt(udp->udp_fd,0,iVar1,(void *)((long)&sin + 4),8);
  if (iVar1 == 0) {
    udp_local._4_4_ = 0;
  }
  else {
    piVar2 = __errno_location();
    udp_local._4_4_ = nni_plat_errno(*piVar2);
  }
  return udp_local._4_4_;
}

Assistant:

static int
ip4_multicast_member(nni_plat_udp *udp, struct sockaddr *sa, bool join)
{
	struct ip_mreq          mreq;
	struct sockaddr_in     *sin;
	struct sockaddr_storage local;
	socklen_t               sz = sizeof(local);

	if (getsockname(udp->udp_fd, (struct sockaddr *) &local, &sz) >= 0) {
		if (local.ss_family != AF_INET) {
			// address families have to match
			return (NNG_EADDRINVAL);
		}
		sin                       = (struct sockaddr_in *) &local;
		mreq.imr_interface.s_addr = sin->sin_addr.s_addr;
	} else {
		mreq.imr_interface.s_addr = INADDR_ANY;
	}

	// Determine our local interface
	sin = (struct sockaddr_in *) sa;

	mreq.imr_multiaddr.s_addr = sin->sin_addr.s_addr;
	if (setsockopt(udp->udp_fd, IPPROTO_IP,
	        join ? IP_ADD_MEMBERSHIP : IP_DROP_MEMBERSHIP, &mreq,
	        sizeof(mreq)) == 0) {
		return (0);
	}
	return (nni_plat_errno(errno));
}